

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.h
# Opt level: O1

bool __thiscall
SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>::is_loopback
          (WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_> *this)

{
  bool bVar1;
  endpoint_type rt;
  error_code ec;
  data_union local_3c;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
            ((endpoint_type *)&local_3c.base,
             (this->Socket).super_basic_socket<asio::ip::tcp>.
             super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
             service_,&(this->Socket).super_basic_socket<asio::ip::tcp>.
                       super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                       .implementation_,&local_20);
  bVar1 = true;
  if (local_20._M_value == 0) {
    if (local_3c.base.sa_family == 2) {
      bVar1 = local_3c.base.sa_data[2] == '\x7f';
    }
    else {
      bVar1 = local_3c._23_1_ == '\x01' &&
              ((((((local_3c._18_1_ == '\0' && local_3c._17_1_ == '\0') && local_3c._19_1_ == '\0')
                 && local_3c._20_1_ == '\0') && local_3c._21_1_ == '\0') && local_3c._22_1_ == '\0')
              && (((((((local_3c.base.sa_data[9] == '\0' && local_3c.base.sa_data[8] == '\0') &&
                      local_3c.base.sa_data[10] == '\0') && local_3c.base.sa_data[0xb] == '\0') &&
                    local_3c.base.sa_data[0xc] == '\0') && local_3c.base.sa_data[0xd] == '\0') &&
                  local_3c._16_1_ == '\0') &&
                 (local_3c.base.sa_data[7] == '\0' && local_3c.base.sa_data[6] == '\0')));
    }
  }
  return bVar1;
}

Assistant:

virtual bool is_loopback() const override
        {
            std::error_code ec;
            auto rt(Socket.lowest_layer().remote_endpoint(ec));
            if (!ec)
                return rt.address().is_loopback();
            else
                return true;
        }